

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O2

ByteString * OSSL::oid2ByteString(ByteString *__return_storage_ptr__,int nid)

{
  int iVar1;
  ASN1_PRINTABLESTRING *str;
  string name;
  uchar *p;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  uchar *local_20;
  
  ByteString::ByteString(__return_storage_ptr__);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  if ((((nid == 0x40a) || (nid == 0x40b)) || (nid == 0x440)) || (nid == 0x43f)) {
    std::__cxx11::string::assign((char *)&local_40);
    str = ASN1_PRINTABLESTRING_new();
    ASN1_STRING_set(str,local_40,(int)local_38);
    iVar1 = i2d_ASN1_PRINTABLESTRING(str,(uchar **)0x0);
    ByteString::resize(__return_storage_ptr__,(long)iVar1);
    local_20 = ByteString::operator[](__return_storage_ptr__,0);
    i2d_ASN1_PRINTABLESTRING(str,&local_20);
    ASN1_PRINTABLESTRING_free(str);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSL::oid2ByteString(int nid)
{
	ByteString rv;
	std::string name;

	switch (nid)
	{
		case EVP_PKEY_ED25519:
			name = "edwards25519";
			break;

		case EVP_PKEY_X25519:
			name = "curve25519";
			break;

		case EVP_PKEY_ED448:
			name = "edwards448";
			break;

		case EVP_PKEY_X448:
			name = "curve448";
			break;

		default:
			return rv;
	}

	ASN1_PRINTABLESTRING *str = ASN1_PRINTABLESTRING_new();
	ASN1_STRING_set(str, name.c_str(), name.length());
	rv.resize(i2d_ASN1_PRINTABLESTRING(str, NULL));
	unsigned char *p = &rv[0];
	i2d_ASN1_PRINTABLESTRING(str, &p);
	ASN1_PRINTABLESTRING_free(str);

	return rv;
}